

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arrow_type_extension.cpp
# Opt level: O1

void __thiscall
duckdb::ArrowTypeExtension::ArrowTypeExtension
          (ArrowTypeExtension *this,string *extension_name,string *arrow_format,
          shared_ptr<duckdb::ArrowTypeExtensionData,_true> *type)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  element_type *peVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  this->populate_arrow_schema = (populate_arrow_schema_t)0x0;
  this->get_type = (get_type_t)0x0;
  local_b0._M_dataplus._M_p = (extension_name->_M_dataplus)._M_p;
  paVar1 = &extension_name->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p == paVar1) {
    local_b0.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
    local_b0.field_2._8_8_ = *(undefined8 *)((long)&extension_name->field_2 + 8);
    local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  }
  else {
    local_b0.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
  }
  local_b0._M_string_length = extension_name->_M_string_length;
  (extension_name->_M_dataplus)._M_p = (pointer)paVar1;
  extension_name->_M_string_length = 0;
  (extension_name->field_2)._M_local_buf[0] = '\0';
  local_50._M_string_length = 0;
  local_50.field_2._M_local_buf[0] = '\0';
  local_70._M_string_length = 0;
  local_70.field_2._M_local_buf[0] = '\0';
  local_90._M_dataplus._M_p = (arrow_format->_M_dataplus)._M_p;
  paVar1 = &arrow_format->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p == paVar1) {
    local_90.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
    local_90.field_2._8_8_ = *(undefined8 *)((long)&arrow_format->field_2 + 8);
    local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  }
  else {
    local_90.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
  }
  local_90._M_string_length = arrow_format->_M_string_length;
  (arrow_format->_M_dataplus)._M_p = (pointer)paVar1;
  arrow_format->_M_string_length = 0;
  (arrow_format->field_2)._M_local_buf[0] = '\0';
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  ArrowExtensionMetadata::ArrowExtensionMetadata
            (&this->extension_metadata,&local_b0,&local_50,&local_70,&local_90);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p);
  }
  (this->type_extension).internal.
  super___shared_ptr<duckdb::ArrowTypeExtensionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  peVar2 = (type->internal).
           super___shared_ptr<duckdb::ArrowTypeExtensionData,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  p_Var3 = (type->internal).
           super___shared_ptr<duckdb::ArrowTypeExtensionData,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  (type->internal).super___shared_ptr<duckdb::ArrowTypeExtensionData,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->type_extension).internal.
  super___shared_ptr<duckdb::ArrowTypeExtensionData,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar2;
  (this->type_extension).internal.
  super___shared_ptr<duckdb::ArrowTypeExtensionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       p_Var3;
  (type->internal).super___shared_ptr<duckdb::ArrowTypeExtensionData,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  return;
}

Assistant:

ArrowTypeExtension::ArrowTypeExtension(string extension_name, string arrow_format,
                                       shared_ptr<ArrowTypeExtensionData> type)
    : extension_metadata(std::move(extension_name), {}, {}, std::move(arrow_format)), type_extension(std::move(type)) {
}